

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSatG.c
# Opt level: O0

int Cec3_ManSimHashKey(word *pSim,int nSims,int nTableSize)

{
  uint local_2c;
  int nSimsU;
  int i;
  uint *pSimU;
  uint uHash;
  int nTableSize_local;
  int nSims_local;
  word *pSim_local;
  
  pSimU._4_4_ = 0;
  if ((*pSim & 1) == 0) {
    for (local_2c = 0; (int)local_2c < nSims << 1; local_2c = local_2c + 1) {
      pSimU._4_4_ = *(int *)((long)pSim + (long)(int)local_2c * 4) *
                    Cec3_ManSimHashKey::s_Primes[(int)(local_2c & 0xf)] ^ pSimU._4_4_;
    }
  }
  else {
    for (local_2c = 0; (int)local_2c < nSims << 1; local_2c = local_2c + 1) {
      pSimU._4_4_ = (*(uint *)((long)pSim + (long)(int)local_2c * 4) ^ 0xffffffff) *
                    Cec3_ManSimHashKey::s_Primes[(int)(local_2c & 0xf)] ^ pSimU._4_4_;
    }
  }
  return pSimU._4_4_ % (uint)nTableSize;
}

Assistant:

int Cec3_ManSimHashKey( word * pSim, int nSims, int nTableSize )
{
    static int s_Primes[16] = { 
        1291, 1699, 1999, 2357, 2953, 3313, 3907, 4177, 
        4831, 5147, 5647, 6343, 6899, 7103, 7873, 8147 };
    unsigned uHash = 0, * pSimU = (unsigned *)pSim;
    int i, nSimsU = 2 * nSims;
    if ( pSimU[0] & 1 )
        for ( i = 0; i < nSimsU; i++ )
            uHash ^= ~pSimU[i] * s_Primes[i & 0xf];
    else
        for ( i = 0; i < nSimsU; i++ )
            uHash ^= pSimU[i] * s_Primes[i & 0xf];
    return (int)(uHash % nTableSize);

}